

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::EditingIterator::
RemoveCurrent(EditingIterator *this,NoCheckHeapAllocator *allocator)

{
  NodeBase *pNVar1;
  long extraout_RDX;
  code *local_48;
  FreeFuncType freeFunc;
  NodeBase *dead;
  NoCheckHeapAllocator *allocator_local;
  EditingIterator *this_local;
  
  pNVar1 = (this->super_Iterator).current;
  UnlinkCurrent(this);
  local_48 = (code *)Memory::TypeAllocatorFunc<Memory::NoCheckHeapAllocator,_Js::RangeUnit<int>_>::
                     GetFreeFunc();
  if (((ulong)local_48 & 1) != 0) {
    local_48 = *(code **)(local_48 + *(long *)(allocator + extraout_RDX) + -1);
  }
  (*local_48)(allocator + extraout_RDX,pNVar1,0x10);
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            const NodeBase *dead = this->current;
            UnlinkCurrent();

            auto freeFunc = TypeAllocatorFunc<TAllocator, TData>::GetFreeFunc();

            AllocatorFree(allocator, freeFunc, (Node *) dead, sizeof(Node));
        }